

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

void __thiscall pbrt::Tensor::Tensor(Tensor *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  Tensor *pTVar4;
  uchar *puVar5;
  byte bVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  size_t sVar9;
  uchar *puVar10;
  long __off;
  mapped_type *pmVar11;
  char *pcVar12;
  ulong uVar13;
  ulong __n;
  uint uVar14;
  ulong uVar15;
  uint8_t dtype;
  uint8_t version [2];
  uint16_t ndim;
  uint16_t name_length;
  uint32_t n_fields;
  string name;
  uint64_t size_value;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  uint64_t offset;
  uint8_t header [12];
  byte local_f1;
  string *local_f0;
  char local_e2;
  char local_e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string *local_d8;
  ushort local_cc;
  ushort local_ca;
  Tensor *local_c8;
  uint local_c0;
  uint local_bc;
  key_type local_b8;
  uint local_98;
  undefined4 uStack_94;
  size_t sStack_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  uchar *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  ulong local_50;
  size_t local_48;
  long local_3c;
  int local_34;
  
  (this->m_fields)._M_h._M_buckets = &(this->m_fields)._M_h._M_single_bucket;
  (this->m_fields)._M_h._M_bucket_count = 1;
  (this->m_fields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_fields)._M_h._M_element_count = 0;
  (this->m_fields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_fields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_fields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f0 = &this->m_filename;
  paVar1 = &(this->m_filename).field_2;
  (this->m_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + filename->_M_string_length);
  local_d8 = filename;
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar12 = "%s: unable to open file";
  }
  else {
    iVar7 = fseek(__stream,0,2);
    if (iVar7 == 0) {
      local_e0 = paVar1;
      sVar8 = ftell(__stream);
      pTVar4 = local_c8;
      if (sVar8 == 0xffffffffffffffff) {
        pcVar12 = "%s: Tensor: Unable to tell file cursor position.";
      }
      else {
        local_c8->m_size = sVar8;
        rewind(__stream);
        if (0x11 < pTVar4->m_size) {
          sVar9 = fread(&local_3c,1,0xc,__stream);
          if (sVar9 == 0xc) {
            sVar9 = fread(&local_e2,1,2,__stream);
            if (sVar9 == 2) {
              sVar9 = fread(&local_bc,4,1,__stream);
              if (sVar9 == 1) {
                if (local_34 == 0x656c69 && local_3c == 0x665f726f736e6574) {
                  pcVar12 = "%s: Tensor: Invalid tensor file: unknown file version.";
                  if ((local_e2 == '\x01') && (local_e1 == '\0')) {
                    local_c0 = local_bc;
                    if (local_bc != 0) {
                      uVar15 = 0;
                      do {
                        sVar9 = fread(&local_ca,2,1,__stream);
                        if (sVar9 != 1) {
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>
                                    ("%s: Tensor: Unable to read &name_length.",local_d8);
                        }
                        uVar13 = (ulong)local_ca;
                        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                        std::__cxx11::string::_M_construct((ulong)&local_b8,(char)local_ca);
                        sVar9 = fread(local_b8._M_dataplus._M_p,1,uVar13,__stream);
                        if (sVar9 != uVar13) {
                          pcVar12 = "%s: Tensor: Unable to read (char *)name.data().";
LAB_003a16a5:
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>(pcVar12,local_d8);
                        }
                        sVar9 = fread(&local_cc,2,1,__stream);
                        if (sVar9 != 1) {
                          pcVar12 = "%s: Tensor: Unable to read &ndim.";
                          goto LAB_003a16a5;
                        }
                        sVar9 = fread(&local_f1,1,1,__stream);
                        if (sVar9 != 1) {
                          pcVar12 = "%s: Tensor: Unable to read &dtype.";
                          goto LAB_003a16a5;
                        }
                        sVar9 = fread(&local_48,8,1,__stream);
                        bVar3 = local_f1;
                        if (sVar9 != 1) {
                          pcVar12 = "%s: Tensor: Unable to read &offset.";
                          goto LAB_003a16a5;
                        }
                        if (10 < (byte)(local_f1 - 1)) {
                          pcVar12 = "%s: Tensor: Invalid tensor file: unknown type.";
                          goto LAB_003a16a5;
                        }
                        uVar13 = (ulong)local_cc;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  (&local_68,uVar13,(allocator_type *)&local_98);
                        bVar6 = bVar3 - 1;
                        if (bVar6 < 0xb) {
                          __n = *(ulong *)(&DAT_02cbc180 + (ulong)bVar6 * 8);
                        }
                        else {
                          __n = 0;
                        }
                        local_50 = uVar15;
                        if (uVar13 != 0) {
                          uVar15 = 0;
                          do {
                            sVar9 = fread(&local_98,8,1,__stream);
                            if (sVar9 != 1) {
                              fclose(__stream);
                              ErrorExit<std::__cxx11::string_const&>
                                        ("%s: Tensor: Unable to read &size_value.",local_d8);
                            }
                            local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15] =
                                 CONCAT44(uStack_94,local_98);
                            __n = __n * CONCAT44(uStack_94,local_98);
                            uVar15 = uVar15 + 1;
                          } while (uVar13 != uVar15);
                        }
                        puVar10 = (uchar *)operator_new__(__n);
                        __off = ftell(__stream);
                        sVar8 = local_48;
                        if (__off == -1) {
                          pcVar12 = "%s: Tensor: Unable to tell current cursor position.";
LAB_003a16f5:
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>(pcVar12,local_d8);
                        }
                        iVar7 = fseek(__stream,local_48,0);
                        if (iVar7 == -1) {
                          pcVar12 = "%s: Tensor: Unable to seek to tensor offset.";
                          goto LAB_003a16f5;
                        }
                        sVar9 = fread(puVar10,1,__n,__stream);
                        if (sVar9 != __n) {
                          pcVar12 = "%s: Tensor: Unable to read data.get().";
                          goto LAB_003a16f5;
                        }
                        iVar7 = fseek(__stream,__off,0);
                        if (iVar7 == -1) {
                          pcVar12 = "%s: Tensor: Unable to seek back to current position";
                          goto LAB_003a16f5;
                        }
                        local_98 = (uint)bVar3;
                        sStack_90 = sVar8;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  (&local_88,&local_68);
                        local_70 = puVar10;
                        pmVar11 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)local_c8,&local_b8);
                        uVar15 = local_50;
                        *(ulong *)pmVar11 = CONCAT44(uStack_94,local_98);
                        pmVar11->offset = sStack_90;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                                  (&pmVar11->shape,&local_88);
                        puVar5 = local_70;
                        local_70 = (uchar *)0x0;
                        puVar10 = (pmVar11->data)._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
                        (pmVar11->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar5;
                        if (puVar10 != (uchar *)0x0) {
                          operator_delete__(puVar10);
                        }
                        if (local_70 != (uchar *)0x0) {
                          operator_delete__(local_70);
                        }
                        local_70 = (uchar *)0x0;
                        if (local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_88.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_88.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_88.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_68.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_68.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_68.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                          operator_delete(local_b8._M_dataplus._M_p,
                                          local_b8.field_2._M_allocated_capacity + 1);
                        }
                        uVar14 = (int)uVar15 + 1;
                        uVar15 = (ulong)uVar14;
                      } while (uVar14 != local_c0);
                    }
                    fclose(__stream);
                    return;
                  }
                }
                else {
                  pcVar12 = "%s: Tensor: Invalid tensor file: invalid header.";
                }
              }
              else {
                pcVar12 = "%s: Tensor: Unable to read &n_fields.";
              }
            }
            else {
              pcVar12 = "%s: Tensor: Unable to read version.";
            }
          }
          else {
            pcVar12 = "%s: Tensor: Unable to read header.";
          }
          fclose(__stream);
          ErrorExit<std::__cxx11::string_const&>(pcVar12,local_d8);
        }
        pcVar12 = "%s: Tensor: Invalid tensor file: too small, truncated?";
      }
      fclose(__stream);
      ErrorExit<std::__cxx11::string_const&>(pcVar12,local_d8);
    }
    fclose(__stream);
    pcVar12 = "%s: Tensor: Unable to seek to end of file.";
  }
  ErrorExit<std::__cxx11::string_const&>(pcVar12,local_d8);
}

Assistant:

Tensor::Tensor(const std::string &filename) : m_filename(filename) {
    // Helpful macros to limit error-handling code duplication
#ifdef ASSERT
#undef ASSERT
#endif  // ASSERT

#define ASSERT(cond, msg)                            \
    do {                                             \
        if (!(cond)) {                               \
            fclose(file);                            \
            ErrorExit("%s: Tensor: " msg, filename); \
        }                                            \
    } while (0)

#define SAFE_READ(vars, size, count) \
    ASSERT(fread(vars, size, count, file) == (count), "Unable to read " #vars ".")

    FILE *file = fopen(filename.c_str(), "rb");
    if (file == NULL)
        ErrorExit("%s: unable to open file", filename);

    ASSERT(!fseek(file, 0, SEEK_END), "Unable to seek to end of file.");

    long size = ftell(file);
    ASSERT(size != -1, "Unable to tell file cursor position.");
    m_size = static_cast<size_t>(size);
    rewind(file);

    ASSERT(m_size >= 12 + 2 + 4, "Invalid tensor file: too small, truncated?");

    uint8_t header[12], version[2];
    uint32_t n_fields;
    SAFE_READ(header, sizeof(*header), 12);
    SAFE_READ(version, sizeof(*version), 2);
    SAFE_READ(&n_fields, sizeof(n_fields), 1);

    ASSERT(memcmp(header, "tensor_file", 12) == 0,
           "Invalid tensor file: invalid header.");
    ASSERT(version[0] == 1 && version[1] == 0,
           "Invalid tensor file: unknown file version.");

    for (uint32_t i = 0; i < n_fields; ++i) {
        uint8_t dtype;
        uint16_t name_length, ndim;
        uint64_t offset;

        SAFE_READ(&name_length, sizeof(name_length), 1);
        std::string name(name_length, '\0');
        SAFE_READ((char *)name.data(), 1, name_length);
        SAFE_READ(&ndim, sizeof(ndim), 1);
        SAFE_READ(&dtype, sizeof(dtype), 1);
        SAFE_READ(&offset, sizeof(offset), 1);
        ASSERT(dtype != Invalid && dtype <= Float64,
               "Invalid tensor file: unknown type.");

        std::vector<size_t> shape(ndim);
        size_t total_size = type_size((Type)dtype);  // no need to check here, line 43
                                                     // already removes invalid types
        for (size_t j = 0; j < (size_t)ndim; ++j) {
            uint64_t size_value;
            SAFE_READ(&size_value, sizeof(size_value), 1);
            shape[j] = (size_t)size_value;
            total_size *= shape[j];
        }

        auto data = std::unique_ptr<uint8_t[]>(new uint8_t[total_size]);

        long cur_pos = ftell(file);
        ASSERT(cur_pos != -1, "Unable to tell current cursor position.");
        ASSERT(fseek(file, offset, SEEK_SET) != -1, "Unable to seek to tensor offset.");
        SAFE_READ(data.get(), 1, total_size);
        ASSERT(fseek(file, cur_pos, SEEK_SET) != -1,
               "Unable to seek back to current position");

        m_fields[name] =
            Field{(Type)dtype, static_cast<size_t>(offset), shape, std::move(data)};
    }

    fclose(file);

#undef SAFE_READ
#undef ASSERT
}